

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_2::HBox::ComputeRequirement(HBox *this)

{
  Box *pBVar1;
  int *piVar2;
  Requirement *pRVar3;
  Selection SVar4;
  int iVar5;
  pointer psVar6;
  element_type *peVar7;
  int iVar8;
  int iVar9;
  shared_ptr<ftxui::Node> *child;
  pointer psVar10;
  
  (this->super_Node).requirement_.flex_grow_y = 0;
  (this->super_Node).requirement_.flex_shrink_x = 0;
  (this->super_Node).requirement_.flex_shrink_y = 0;
  (this->super_Node).requirement_.selection = NORMAL;
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  (this->super_Node).requirement_.flex_grow_x = 0;
  (this->super_Node).requirement_.flex_grow_y = 0;
  psVar10 = (this->super_Node).children_.
            super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar6) {
    do {
      (*((psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Node
        [2])();
      peVar7 = (psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      SVar4 = (peVar7->requirement_).selection;
      if ((int)(this->super_Node).requirement_.selection < (int)SVar4) {
        (this->super_Node).requirement_.selection = SVar4;
        iVar9 = (peVar7->requirement_).selected_box.x_max;
        iVar5 = (peVar7->requirement_).selected_box.y_min;
        iVar8 = (peVar7->requirement_).selected_box.y_max;
        (this->super_Node).requirement_.selected_box.x_min =
             (peVar7->requirement_).selected_box.x_min;
        (this->super_Node).requirement_.selected_box.x_max = iVar9;
        (this->super_Node).requirement_.selected_box.y_min = iVar5;
        (this->super_Node).requirement_.selected_box.y_max = iVar8;
        iVar9 = (this->super_Node).requirement_.min_x;
        pBVar1 = &(this->super_Node).requirement_.selected_box;
        pBVar1->x_min = pBVar1->x_min + iVar9;
        piVar2 = &(this->super_Node).requirement_.selected_box.x_max;
        *piVar2 = *piVar2 + iVar9;
      }
      peVar7 = (psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pRVar3 = &(this->super_Node).requirement_;
      pRVar3->min_x = pRVar3->min_x + (peVar7->requirement_).min_x;
      iVar9 = (peVar7->requirement_).min_y;
      iVar5 = (this->super_Node).requirement_.min_y;
      if (iVar9 < iVar5) {
        iVar9 = iVar5;
      }
      (this->super_Node).requirement_.min_y = iVar9;
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar6);
  }
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    requirement_.flex_grow_x = 0;
    requirement_.flex_grow_y = 0;
    requirement_.flex_shrink_x = 0;
    requirement_.flex_shrink_y = 0;
    requirement_.selection = Requirement::NORMAL;
    for (auto& child : children_) {
      child->ComputeRequirement();
      if (requirement_.selection < child->requirement().selection) {
        requirement_.selection = child->requirement().selection;
        requirement_.selected_box = child->requirement().selected_box;
        requirement_.selected_box.x_min += requirement_.min_x;
        requirement_.selected_box.x_max += requirement_.min_x;
      }
      requirement_.min_x += child->requirement().min_x;
      requirement_.min_y =
          std::max(requirement_.min_y, child->requirement().min_y);
    }
  }